

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

bool OpenMD::operator==(SelectionSet *ss1,SelectionSet *ss2)

{
  bool bVar1;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RSI;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDI;
  int i;
  OpenMDBitSet *in_stack_00000038;
  OpenMDBitSet *in_stack_00000040;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (5 < local_1c) {
      return true;
    }
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RDI,(long)local_1c);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RSI,(long)local_1c);
    bVar1 = operator==(in_stack_00000040,in_stack_00000038);
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool operator==(const SelectionSet& ss1, const SelectionSet& ss2) {
    for (int i = 0; i < N_SELECTIONTYPES; i++) {
      assert(ss1.bitsets_[i].size() == ss2.bitsets_[i].size());
      if (!(ss1.bitsets_[i] == ss2.bitsets_[i])) return false;
    }

    return true;
  }